

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_load(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *argument_00;
  char arg [4608];
  char local_1218 [4608];
  
  log_naughty(ch,argument,1);
  argument_00 = one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  load mob <vnum>\n\r",ch);
    send_to_char("  load obj <vnum> <level>\n\r",ch);
  }
  else {
    bVar1 = str_cmp(local_1218,"mob");
    if ((bVar1) && (bVar1 = str_cmp(local_1218,"char"), bVar1)) {
      bVar1 = str_cmp(local_1218,"obj");
      if (bVar1) {
        do_load(ch,"");
        return;
      }
      do_oload(ch,argument_00);
      return;
    }
    do_mload(ch,argument_00);
  }
  return;
}

Assistant:

void do_load(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	log_naughty(ch, argument, 1);
	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  load mob <vnum>\n\r", ch);
		send_to_char("  load obj <vnum> <level>\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "mob") || !str_cmp(arg, "char"))
	{
		do_mload(ch, argument);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_oload(ch, argument);
		return;
	}

	/* echo syntax */
	do_load(ch, "");
}